

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMeasurementsTest.cpp
# Opt level: O1

int TestMeasurementsTest(int argc,char **argv)

{
  pointer pcVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  EStatusCode EVar4;
  EncryptionOptions *pEVar5;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *this_00;
  _List_node_base *p_Var6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  DoubleAndDoublePairList pathPoints;
  TextOptions textOptions;
  GraphicOptions pathStrokeOptions;
  TextMeasures textDimensions;
  PDFWriter pdfWriter;
  string local_1058;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1038;
  _List_node_base *local_1030;
  undefined1 local_1028 [32];
  double local_1008;
  undefined1 local_1000 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fe8;
  undefined1 local_fd0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fb0;
  _Alloc_hider local_f98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f88;
  string local_f70;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  PDFWriter::PDFWriter(&local_ee0);
  paVar3 = &local_1058.field_2;
  local_1058._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1058,"TextMeasurementsTest.pdf","");
  BuildRelativeOutputPath((string *)local_1028,argv,&local_1058);
  local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f70,"TextMeasurementsTest.log","");
  BuildRelativeOutputPath(&local_f50,argv,&local_f70);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1000,true,true,&local_f50);
  pEVar5 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar5->ShouldEncrypt;
  pcVar1 = (pEVar5->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar1,pcVar1 + (pEVar5->UserPassword)._M_string_length);
  local_f08 = pEVar5->UserProtectionOptionsFlag;
  pcVar1 = (pEVar5->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar1,pcVar1 + (pEVar5->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_fd0,true,true,(EncryptionOptions *)local_f30,false);
  EVar4 = PDFWriter::StartPDF(&local_ee0,(string *)local_1028,ePDFVersion13,
                              (LogConfiguration *)local_1000,(PDFCreationSettings *)local_fd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_p != &local_f88) {
    operator_delete(local_f98._M_p,local_f88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc0._M_allocated_capacity != &local_fb0) {
    operator_delete((void *)local_fc0._M_allocated_capacity,local_fb0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1000._8_8_ != &local_fe8) {
    operator_delete((void *)local_1000._8_8_,
                    CONCAT71(local_fe8._M_allocated_capacity._1_7_,local_fe8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_1028._4_4_,local_1028._0_4_) != local_1028 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1028._4_4_,local_1028._0_4_),local_1028._16_8_ + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != paVar3) {
    operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
  }
  if (EVar4 != eSuccess) {
    iVar8 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to start file\n",0x15);
    goto LAB_0015495c;
  }
  this = (PDFPage *)operator_new(0x2b8);
  PDFPage::PDFPage(this);
  PDFRectangle::PDFRectangle((PDFRectangle *)local_fd0,0.0,0.0,595.0,842.0);
  PDFPage::SetMediaBox(this,(PDFRectangle *)local_fd0);
  PDFRectangle::~PDFRectangle((PDFRectangle *)local_fd0);
  inPageContext = PDFWriter::StartPageContentContext(&local_ee0,this);
  local_1058._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,"fonts/arial.ttf","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1000,argv[1],(allocator<char> *)&local_f50);
  LocalPathToFileURL((FileURL *)local_fd0,(string *)local_1000);
  RelativeURLToLocalPath((string *)local_1028,(FileURL *)local_fd0,&local_1058);
  FileURL::~FileURL((FileURL *)local_fd0);
  if ((undefined1 *)local_1000._0_8_ != local_1000 + 0x10) {
    operator_delete((void *)local_1000._0_8_,local_1000._16_8_ + 1);
  }
  this_00 = PDFWriter::GetFontForFile(&local_ee0,(string *)local_1028,0);
  if ((undefined1 *)CONCAT44(local_1028._4_4_,local_1028._0_4_) != local_1028 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1028._4_4_,local_1028._0_4_),local_1028._16_8_ + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != paVar3) {
    operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (PDFUsedFont *)0x0) {
    iVar8 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to create font for arial font\n",0x25);
    goto LAB_0015495c;
  }
  local_fd0._0_8_ = &local_fc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fd0,"DarkMagenta","");
  local_1000._8_8_ = AbstractContentContext::ColorValueForName((string *)local_fd0);
  local_1000._0_8_ = (pointer)0x0;
  local_1000._16_8_ = 0x4010000000000000;
  local_fe8._M_local_buf[0] = '\0';
  local_fe8._8_8_ = 0x406fe00000000000;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd0._0_8_ != &local_fc0) {
    operator_delete((void *)local_fd0._0_8_,(ulong)(local_fc0._M_allocated_capacity + 1));
  }
  local_1028._16_8_ = 0x402c000000000000;
  local_1028._0_4_ = eGray;
  local_1028._8_8_ = 0;
  local_1008 = 255.0;
  local_1058._M_dataplus._M_p = (pointer)paVar3;
  local_1028._24_8_ = this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,"Hello World","");
  PDFUsedFont::CalculateTextDimensions((TextMeasures *)local_fd0,this_00,&local_1058,0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != paVar3) {
    operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
  }
  local_1058._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1058,"Hello World","");
  AbstractContentContext::WriteText
            (&inPageContext->super_AbstractContentContext,10.0,100.0,&local_1058,
             (TextOptions *)local_1028);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != paVar3) {
    operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
  }
  local_1058.field_2._M_allocated_capacity = 0;
  local_1038 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fd0._0_8_;
  local_1030 = (_List_node_base *)local_fd0._8_8_;
  local_1058._M_dataplus._M_p = (pointer)&local_1058;
  local_1058._M_string_length = (size_type)&local_1058;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6[1]._M_next = (_List_node_base *)((double)local_1038 + 10.0);
  p_Var6[1]._M_prev = (_List_node_base *)((double)local_1030 + 98.0);
  std::__detail::_List_node_base::_M_hook(p_Var6);
  local_1058.field_2._M_allocated_capacity = local_1058.field_2._M_allocated_capacity + 1;
  local_1030 = (_List_node_base *)local_fd0._8_8_;
  local_1038 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fc0._M_allocated_capacity;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6[1]._M_next = (_List_node_base *)((double)local_1038 + 10.0);
  p_Var6[1]._M_prev = (_List_node_base *)((double)local_1030 + 98.0);
  std::__detail::_List_node_base::_M_hook(p_Var6);
  local_1058.field_2._M_allocated_capacity = local_1058.field_2._M_allocated_capacity + 1;
  AbstractContentContext::DrawPath
            (&inPageContext->super_AbstractContentContext,(DoubleAndDoublePairList *)&local_1058,
             (GraphicOptions *)local_1000);
  _Var10._M_p = local_1058._M_dataplus._M_p;
  if ((string *)local_1058._M_dataplus._M_p != &local_1058) {
    do {
      plVar2 = *(long **)_Var10._M_p;
      operator_delete(_Var10._M_p,0x20);
      _Var10._M_p = (pointer)plVar2;
    } while ((string *)plVar2 != &local_1058);
  }
  local_1058.field_2._M_allocated_capacity = 0;
  local_1038 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fd0._0_8_;
  local_1030 = (_List_node_base *)local_fc0._8_8_;
  local_1058._M_dataplus._M_p = (pointer)&local_1058;
  local_1058._M_string_length = (size_type)&local_1058;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6[1]._M_next = (_List_node_base *)((double)local_1038 + 10.0);
  p_Var6[1]._M_prev = (_List_node_base *)((double)local_1030 + 102.0);
  std::__detail::_List_node_base::_M_hook(p_Var6);
  local_1058.field_2._M_allocated_capacity = local_1058.field_2._M_allocated_capacity + 1;
  local_1038 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_fc0._M_allocated_capacity;
  local_1030 = (_List_node_base *)local_fc0._8_8_;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6[1]._M_next = (_List_node_base *)((double)local_1038 + 10.0);
  p_Var6[1]._M_prev = (_List_node_base *)((double)local_1030 + 102.0);
  std::__detail::_List_node_base::_M_hook(p_Var6);
  local_1058.field_2._M_allocated_capacity = local_1058.field_2._M_allocated_capacity + 1;
  AbstractContentContext::DrawPath
            (&inPageContext->super_AbstractContentContext,(DoubleAndDoublePairList *)&local_1058,
             (GraphicOptions *)local_1000);
  EVar4 = PDFWriter::EndPageContentContext(&local_ee0,inPageContext);
  if (EVar4 == eSuccess) {
    EVar4 = PDFWriter::WritePageAndRelease(&local_ee0,this);
    if (EVar4 != eSuccess) {
      lVar7 = 0x15;
      pcVar9 = "Failed to write page\n";
      goto LAB_00154e60;
    }
    EVar4 = PDFWriter::EndPDF(&local_ee0);
    if (EVar4 != eSuccess) {
      lVar7 = 0x12;
      pcVar9 = "Failed to end pdf\n";
      goto LAB_00154e60;
    }
    iVar8 = 0;
  }
  else {
    lVar7 = 0x1e;
    pcVar9 = "Failed to end content context\n";
LAB_00154e60:
    iVar8 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  }
  _Var10._M_p = local_1058._M_dataplus._M_p;
  if ((string *)local_1058._M_dataplus._M_p != &local_1058) {
    do {
      paVar3 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)_Var10._M_p;
      operator_delete(_Var10._M_p,0x20);
      _Var10._M_p = (pointer)paVar3;
    } while ((string *)paVar3 != &local_1058);
  }
LAB_0015495c:
  PDFWriter::~PDFWriter(&local_ee0);
  return iVar8;
}

Assistant:

int TestMeasurementsTest(int argc, char* argv[])
{
	EStatusCode status = eSuccess;
	PDFWriter pdfWriter;

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"TextMeasurementsTest.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,
                                                     BuildRelativeOutputPath(argv,"TextMeasurementsTest.log")));
		if(status != eSuccess)
		{
			cout<<"Failed to start file\n";
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
		
		PageContentContext* cxt = pdfWriter.StartPageContentContext(page);
		PDFUsedFont* arialFont = pdfWriter.GetFontForFile(
                                                     BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/arial.ttf"));
		if(!arialFont)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font for arial font\n";
			break;
		}

		AbstractContentContext::GraphicOptions pathStrokeOptions(AbstractContentContext::eStroke,
																AbstractContentContext::eRGB,
																AbstractContentContext::ColorValueForName("DarkMagenta"),
																4);
		AbstractContentContext::TextOptions textOptions(arialFont,
														14,
														AbstractContentContext::eGray,
														0);

		PDFUsedFont::TextMeasures textDimensions = arialFont->CalculateTextDimensions("Hello World",14);

		cxt->WriteText(10,100,"Hello World",textOptions);
		DoubleAndDoublePairList pathPoints;
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,98+textDimensions.yMin));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,98+textDimensions.yMin));
		cxt->DrawPath(pathPoints,pathStrokeOptions);
		pathPoints.clear();
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,102+textDimensions.yMax));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,102+textDimensions.yMax));
		cxt->DrawPath(pathPoints,pathStrokeOptions);

		status = pdfWriter.EndPageContentContext(cxt);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to write page\n";
			break;
		}


		status = pdfWriter.EndPDF();
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end pdf\n";
			break;
		}

	}while(false);


	return status == eSuccess ? 0:1;
}